

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O0

int testFileWriterTestsReadData(void)

{
  string *psVar1;
  ostream *poVar2;
  Span<unsigned_char,_18446744073709551615UL> SVar3;
  Span<unsigned_char,_18446744073709551615UL> data;
  runtime_error *ex;
  bool caughtCorrectException;
  undefined1 local_298 [8];
  FileWriter writer;
  uint64_t offset2;
  uint64_t offset1;
  data_p2 out2;
  data_p1 out1;
  data data1;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile((AutoDeleteTempFile *)&data1.c);
  out1.a = 'b';
  out1.b = 0x17;
  data1.a = '-';
  data1._1_3_ = 0x3e7024;
  data1.b._0_1_ = 's';
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&data1.c);
  SVar3 = (anonymous_namespace)::CastAndMakeSpan<testFileWriterTestsReadData()::data>((data *)&out1)
  ;
  data.m_ptr = SVar3.m_size.m_size;
  writer._520_8_ = SVar3.m_ptr;
  data.m_size.m_size = writer._520_8_;
  MILBlob::TestUtil::WriteBlobFile<unsigned_char,18446744073709551615ul>
            ((TestUtil *)psVar1,(string *)writer._520_8_,data);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&data1.c);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_298,psVar1,false);
  SVar3 = (anonymous_namespace)::CastAndMakeSpan<testFileWriterTestsReadData()::data_p1>
                    ((data_p1 *)&out2);
  MILBlob::Blob::FileWriter::ReadData((FileWriter *)local_298,0,SVar3);
  SVar3 = (anonymous_namespace)::CastAndMakeSpan<testFileWriterTestsReadData()::data_p2>
                    ((data_p2 *)&offset1);
  MILBlob::Blob::FileWriter::ReadData((FileWriter *)local_298,8,SVar3);
  if (out1.a == out2.c._0_1_) {
    if (out1.b == out2._4_4_) {
      if (((float)data1._0_4_ != (float)offset1) || (NAN((float)data1._0_4_) || NAN((float)offset1))
         ) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xbe);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(data1.c) == (out2.c)");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else if ((char)data1.b == offset1._4_1_) {
        SVar3 = (anonymous_namespace)::CastAndMakeSpan<testFileWriterTestsReadData()::data>
                          ((data *)&out1);
        MILBlob::Blob::FileWriter::ReadData((FileWriter *)local_298,8,SVar3);
        poVar2 = std::operator<<((ostream *)&std::clog,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc4);
        std::operator<<(poVar2,": expected exception, but none thrown.\n");
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xbf);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(data1.d) == (out2.d)");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xbd);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(data1.b) == (out1.b)");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xbc);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(data1.a) == (out1.a)");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_298);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)&data1.c);
  return 1;
}

Assistant:

int testFileWriterTestsReadData()
{
    AutoDeleteTempFile tempfile;
    // Reading Data from file via Writer
    {
        struct data {
            char a;
            int b;
            float c;
            char d;
        };

        struct data_p1 {
            char a;
            int b;
        };

        struct data_p2 {
            float c;
            char d;
        };

        data data1;
        data1.a = 'b';
        data1.b = 23;
        data1.c = 0.234513f;
        data1.d = 's';

        data_p1 out1;
        data_p2 out2;

        uint64_t offset1 = 0;
        uint64_t offset2 = sizeof(out1);
        {
            TestUtil::WriteBlobFile(tempfile.GetFilename(), CastAndMakeSpan(data1));
        }

        FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);

        writer.ReadData(offset1, CastAndMakeSpan(out1));
        writer.ReadData(offset2, CastAndMakeSpan(out2));

        // Validate data
        ML_ASSERT_EQ(data1.a, out1.a);
        ML_ASSERT_EQ(data1.b, out1.b);
        ML_ASSERT_EQ(data1.c, out2.c);
        ML_ASSERT_EQ(data1.d, out2.d);

        // Unable to read data i.e. reached end of file
        ML_ASSERT_THROWS_WITH_MESSAGE(writer.ReadData(offset2, CastAndMakeSpan(data1)),
                                      std::runtime_error,
                                      "Unknown error occured while reading data from the file.");
    }

    return 0;
}